

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::cpp::(anonymous_namespace)::ConditionalToCheckBitmasks_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *masks,bool return_success,
          string_view has_bits_var)

{
  string_view pc;
  undefined8 uVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  LogMessage *pLVar5;
  reference pvVar6;
  undefined7 in_register_00000009;
  AlphaNum *pAVar7;
  AlphaNum *c;
  string_view separator;
  char (*in_stack_fffffffffffffc88) [2];
  char *__rhs;
  AlphaNum local_350;
  byte local_319;
  basic_string_view<char,_std::char_traits<char>_> local_318;
  string local_308;
  AlphaNum local_2e8;
  AlphaNum local_2b8;
  undefined1 local_288 [8];
  string result;
  basic_string_view<char,_std::char_traits<char>_> local_260;
  LogMessageFatal local_250 [23];
  Voidify local_239;
  AlphaNum local_238;
  AlphaNum local_208;
  AlphaNum local_1d8;
  size_t local_1a8;
  AlphaNum *pAStack_1a0;
  AlphaNum local_198;
  AlphaNum local_168;
  string local_138;
  string local_118;
  Hex local_f0;
  AlphaNum local_e0;
  AlphaNum local_a0;
  undefined1 local_70 [8];
  string m;
  size_t i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  bool return_success_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *masks_local;
  string_view has_bits_var_local;
  
  pAVar7 = (AlphaNum *)has_bits_var._M_len;
  parts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = (byte)masks & 1;
  c = pAVar7;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&i);
  for (m.field_2._8_8_ = 0; uVar1 = m.field_2._8_8_,
      sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this),
      (ulong)uVar1 < sVar3; m.field_2._8_8_ = m.field_2._8_8_ + 1) {
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this,m.field_2._8_8_)
    ;
    if (*pvVar4 != 0) {
      absl::lts_20240722::AlphaNum::AlphaNum(&local_a0,"0x");
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this,
                          m.field_2._8_8_);
      absl::lts_20240722::Hex::Hex<unsigned_int>(&local_f0,*pvVar4,kZeroPad8,(type *)0x0);
      local_118.field_2._M_allocated_capacity = 0;
      local_118.field_2._8_8_ = 0;
      local_118._M_dataplus = (_Alloc_hider)0x0;
      local_118._1_7_ = 0;
      local_118._M_string_length = 0;
      absl::lts_20240722::strings_internal::StringifySink::StringifySink
                ((StringifySink *)&local_118);
      absl::lts_20240722::AlphaNum::AlphaNum<absl::lts_20240722::Hex,void>
                (&local_e0,&local_f0,(StringifySink *)&local_118);
      absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_70,&local_a0);
      absl::lts_20240722::strings_internal::StringifySink::~StringifySink
                ((StringifySink *)&local_118);
      absl::lts_20240722::AlphaNum::AlphaNum(&local_168,"((");
      pc._M_str = (char *)pAVar7;
      pc._M_len = CONCAT71(in_register_00000009,return_success);
      local_1a8 = CONCAT71(in_register_00000009,return_success);
      pAStack_1a0 = pAVar7;
      absl::lts_20240722::AlphaNum::AlphaNum(&local_198,pc);
      absl::lts_20240722::AlphaNum::AlphaNum(&local_1d8,"[");
      absl::lts_20240722::AlphaNum::AlphaNum(&local_208,m.field_2._8_8_);
      absl::lts_20240722::AlphaNum::AlphaNum(&local_238,"] & ");
      c = &local_208;
      absl::lts_20240722::StrCat<std::__cxx11::string,char[5],std::__cxx11::string,char[2]>
                (&local_138,(lts_20240722 *)&local_168,&local_198,&local_1d8,c,&local_238,
                 (AlphaNum *)local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)") ^ ",
                 (char (*) [5])local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6cc8a1,
                 in_stack_fffffffffffffc88);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&i,&local_138);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)local_70);
    }
  }
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&i);
  result.field_2._M_local_buf[0xf] = '\0';
  if (bVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_260,"!parts.empty()");
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_250,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/compiler/cpp/message.cc"
               ,0x56,local_260._M_len);
    result.field_2._M_local_buf[0xf] = '\x01';
    pLVar5 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_250);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_239,pLVar5);
    c = (AlphaNum *)local_260._M_str;
  }
  if ((result.field_2._M_local_buf[0xf] & 1U) != 0) {
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_250);
  }
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&i);
  local_319 = 0;
  if (sVar3 == 1) {
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&i,0);
    std::__cxx11::string::string((string *)local_288,(string *)pvVar6);
  }
  else {
    absl::lts_20240722::AlphaNum::AlphaNum(&local_2b8,"(");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_318,"\n       | ");
    separator._M_str = (char *)c;
    separator._M_len = (size_t)local_318._M_str;
    absl::lts_20240722::
    StrJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_308,(lts_20240722 *)&i,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_318._M_len,separator);
    local_319 = 1;
    absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_2e8,&local_308);
    absl::lts_20240722::AlphaNum::AlphaNum(&local_350,")");
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_288,&local_2b8,&local_2e8);
  }
  if ((local_319 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_308);
  }
  if ((parts.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    __rhs = " != 0";
  }
  else {
    __rhs = " == 0";
  }
  std::operator+(__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288,
                 __rhs);
  std::__cxx11::string::~string((string *)local_288);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&i);
  return __return_storage_ptr__;
}

Assistant:

std::string ConditionalToCheckBitmasks(
    const std::vector<uint32_t>& masks, bool return_success = true,
    absl::string_view has_bits_var = "_impl_._has_bits_") {
  std::vector<std::string> parts;
  for (size_t i = 0; i < masks.size(); ++i) {
    if (masks[i] == 0) continue;
    std::string m = absl::StrCat("0x", absl::Hex(masks[i], absl::kZeroPad8));
    // Each xor evaluates to 0 if the expected bits are present.
    parts.push_back(
        absl::StrCat("((", has_bits_var, "[", i, "] & ", m, ") ^ ", m, ")"));
  }
  ABSL_CHECK(!parts.empty());
  // If we have multiple parts, each expected to be 0, then bitwise-or them.
  std::string result =
      parts.size() == 1
          ? parts[0]
          : absl::StrCat("(", absl::StrJoin(parts, "\n       | "), ")");
  return result + (return_success ? " == 0" : " != 0");
}